

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_1;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *args_2;
  ParameterDeclarationSyntax *pPVar1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor local_31;
  Token local_30;
  
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  args_1 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x28),&local_31,(BumpAllocator *)__child_stack);
  args_2 = deepClone<slang::syntax::DeclaratorSyntax>
                     ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)(__fn + 0x30),
                      (BumpAllocator *)__child_stack);
  pPVar1 = BumpAllocator::
           emplace<slang::syntax::ParameterDeclarationSyntax,slang::parsing::Token,slang::syntax::DataTypeSyntax&,slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>&>
                     ((BumpAllocator *)__child_stack,&local_30,(DataTypeSyntax *)args_1,args_2);
  return (int)pPVar1;
}

Assistant:

static SyntaxNode* clone(const ParameterDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ParameterDeclarationSyntax>(
        node.keyword.deepClone(alloc),
        *deepClone<DataTypeSyntax>(*node.type, alloc),
        *deepClone(node.declarators, alloc)
    );
}